

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usha.c
# Opt level: O3

int USHABlockSize(SHAversion whichSha)

{
  int iVar1;
  
  iVar1 = 0x80;
  if (whichSha < SHA512) {
    iVar1 = *(int *)(&DAT_001556e0 + (ulong)whichSha * 4);
  }
  return iVar1;
}

Assistant:

int USHABlockSize(enum SHAversion whichSha)
{
    switch (whichSha) {
    case SHA1:   return SHA1_Message_Block_Size;
    case SHA224: return SHA224_Message_Block_Size;
    case SHA256: return SHA256_Message_Block_Size;
    case SHA384: return SHA384_Message_Block_Size;
    default:
    case SHA512: return SHA512_Message_Block_Size;
    }
}